

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O1

int lisppathname(char *fullname,char *lispname,int dirp,int versionp)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  byte *pbVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  char cVar11;
  byte *pbVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  char *unaff_R12;
  char *pcVar16;
  byte *pbVar17;
  char *pcVar18;
  char ver_buf [16];
  char ver [16];
  char namebuf [4096];
  char fbuf [4096];
  char local_2058 [16];
  char local_2048 [15];
  byte bStack_2039;
  undefined2 local_2038;
  char local_2036 [4094];
  undefined1 local_1038 [4104];
  
  iVar4 = strcmp(fullname,"/");
  if (iVar4 == 0) {
    lispname[0] = '<';
    lispname[1] = '\0';
    return 1;
  }
  if (dirp == 0) {
    pcVar13 = lispname;
    unaff_R12 = lispname + -1;
    while( true ) {
      while (cVar11 = *pcVar13, cVar11 == '\'') {
        if (pcVar13[1] == '\0') {
          pcVar13 = pcVar13 + 1;
        }
        else {
          pcVar13 = pcVar13 + 2;
        }
      }
      if (cVar11 == '\0') break;
      pcVar13 = pcVar13 + 1;
      if (cVar11 == '>') {
        unaff_R12 = pcVar13;
      }
    }
    pcVar13 = strrchr(fullname,0x2f);
    pbVar7 = (byte *)(pcVar13 + 1);
  }
  else {
    sVar6 = strlen(fullname);
    pbVar7 = (byte *)(fullname + sVar6);
  }
  local_2038._0_1_ = '<';
  if (fullname[1] == '<') {
    pcVar13 = local_2036;
    local_2038._1_1_ = 0x27;
    pbVar17 = (byte *)(fullname + 2);
    local_2036[0] = fullname[1];
  }
  else {
    pbVar17 = (byte *)(fullname + 1);
    pcVar13 = (char *)&local_2038;
  }
  pbVar12 = (byte *)((long)pcVar13 + 1);
  if (pbVar17 < pbVar7) {
    lVar8 = (long)pbVar7 - (long)pbVar17;
    do {
      bVar1 = *pbVar17;
      if (bVar1 < 0x3b) {
        if (bVar1 != 0x27) {
          if (bVar1 != 0x2f) goto LAB_001364e8;
          *pbVar12 = 0x3e;
          goto LAB_001364ea;
        }
LAB_001364dc:
        *pbVar12 = 0x27;
        pbVar12[1] = bVar1;
        pbVar12 = pbVar12 + 2;
      }
      else {
        if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) goto LAB_001364dc;
LAB_001364e8:
        *pbVar12 = bVar1;
LAB_001364ea:
        pbVar12 = pbVar12 + 1;
      }
      pbVar17 = pbVar17 + 1;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  if (dirp == 0) {
    uVar5 = 0;
    uVar14 = 1;
    do {
      while( true ) {
        pcVar13 = unaff_R12 + 1;
        pcVar16 = unaff_R12 + 1;
        if (*pcVar13 != '.') break;
        if (pcVar16 != lispname) {
          uVar15 = 0;
          if (*unaff_R12 == '\'') {
            uVar15 = uVar14;
          }
          uVar5 = uVar5 | uVar15;
        }
        uVar14 = uVar14 * 2;
        unaff_R12 = pcVar16;
      }
      unaff_R12 = pcVar16;
    } while (*pcVar13 != '\0');
    uVar14 = 1;
LAB_0013654f:
    bVar1 = *pbVar17;
    if (bVar1 < 0x3b) {
      if (bVar1 == 0x27) {
LAB_00136583:
        *pbVar12 = 0x27;
        pbVar12[1] = *pbVar17;
        pbVar12 = pbVar12 + 2;
      }
      else {
        if (bVar1 != 0x2e) {
          if (bVar1 != 0) goto LAB_00136597;
          *pbVar12 = 0;
          strcpy(local_1038,(char *)&local_2038);
          pcVar13 = local_2058;
          pcVar16 = local_1038;
          pcVar18 = local_1038;
          while( true ) {
            while (pcVar9 = pcVar16, cVar11 = *pcVar9, cVar11 == '\'') {
              if (pcVar9[1] == '\0') goto LAB_001365ec;
              pcVar16 = pcVar9 + 2;
            }
            if (cVar11 == '\0') break;
            if (cVar11 == '>') {
              pcVar16 = pcVar9 + 1;
              pcVar18 = pcVar9;
            }
            else {
LAB_001365ec:
              pcVar16 = pcVar9 + 1;
            }
          }
          pcVar18 = pcVar18 + 1;
          if (versionp != 0) {
            separate_version(local_1038,local_2048,1);
          }
          cVar11 = *pcVar18;
          if (cVar11 == '\0') {
            bVar3 = true;
          }
          else {
            bVar2 = false;
            do {
              if (cVar11 == '.') {
                bVar2 = true;
              }
              else if ((cVar11 == '\'') && (pcVar18[1] != '\0')) {
                pcVar18 = pcVar18 + 2;
              }
              else {
                pcVar18 = pcVar18 + 1;
              }
              cVar11 = *pcVar18;
              bVar3 = !bVar2;
            } while ((cVar11 != '\0') && (!bVar2));
          }
          if (bVar3) {
            pcVar18[0] = '.';
            pcVar18[1] = '\0';
          }
          strcpy((char *)&local_2038,local_1038);
          if ((versionp != 0) && (local_2048[0] != '\0')) {
            sVar6 = strlen((char *)&local_2038);
            *(undefined2 *)(local_2036 + sVar6 + 0xfffffffffffffffe) = 0x7e2e;
            local_2036[sVar6] = 0;
            strcat((char *)&local_2038,local_2048);
            sVar6 = strlen((char *)&local_2038);
            *(undefined2 *)(local_2036 + sVar6 + 0xfffffffffffffffe) = 0x7e;
          }
          if (versionp != 0) {
            pcVar18 = strchr((char *)&local_2038,0x7e);
            pcVar16 = pcVar18;
            if (pcVar18 != (char *)0x0) {
              do {
                pcVar9 = pcVar16;
                lVar8 = 1;
                while( true ) {
                  if (pcVar9[lVar8] == '\0') {
                    if ((pcVar18 == pcVar9) || (lVar8 != 1 || pcVar18[-1] != '.'))
                    goto LAB_0013679c;
                    strncpy(local_2058,pcVar18 + 1,(size_t)(pcVar9 + ~(ulong)pcVar18));
                    local_2058[(long)(pcVar9 + ~(ulong)pcVar18)] = '\0';
                    if (local_2058[0] == '\0') goto LAB_0013679c;
                    goto joined_r0x00136747;
                  }
                  if (pcVar9[lVar8] == '~') break;
                  lVar8 = lVar8 + 1;
                }
                pcVar16 = pcVar9 + lVar8;
                pcVar18 = pcVar9;
              } while( true );
            }
LAB_0013679c:
            sVar6 = strlen((char *)&local_2038);
            *(undefined2 *)(local_2036 + sVar6 + 0xfffffffffffffffe) = 0x313b;
            local_2036[sVar6] = 0;
          }
          goto LAB_001367b2;
        }
        if ((uVar14 & ~uVar5) == 0) {
          *pbVar12 = 0x27;
          pbVar12[1] = *pbVar17;
          pbVar12 = pbVar12 + 2;
        }
        else {
          *pbVar12 = 0x2e;
          pbVar12 = pbVar12 + 1;
        }
        uVar14 = uVar14 * 2;
      }
    }
    else {
      if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) goto LAB_00136583;
LAB_00136597:
      *pbVar12 = bVar1;
      pbVar12 = pbVar12 + 1;
    }
    pbVar17 = pbVar17 + 1;
    goto LAB_0013654f;
  }
  if ((pbVar12[-1] != 0x3e) || (pbVar12[-2] == 0x27)) {
    *pbVar12 = 0x3e;
    pbVar12 = pbVar12 + 1;
  }
  *pbVar12 = 0;
LAB_001367b2:
  strcpy(lispname,(char *)&local_2038);
  return 1;
joined_r0x00136747:
  if (local_2058[0] == '\0') goto LAB_0013675d;
  pcVar13 = pcVar13 + 1;
  if ((byte)(local_2058[0] - 0x3aU) < 0xf6) goto LAB_0013679c;
  local_2058[0] = *pcVar13;
  goto joined_r0x00136747;
LAB_0013675d:
  pcVar18[-1] = ';';
  pcVar18[0] = '\0';
  *pcVar9 = '\0';
  uVar10 = strtoul(pcVar18 + 1,(char **)0x0,10);
  sprintf(local_2058,"%u",uVar10 & 0xffffffff);
  strcat((char *)&local_2038,local_2058);
  goto LAB_001367b2;
}

Assistant:

int lisppathname(char *fullname, char *lispname, int dirp, int versionp)
{
  char *cp, *dp, *lnamep, *cnamep;
  char namebuf[MAXPATHLEN], fbuf[MAXPATHLEN], ver[VERSIONLEN];
  int i, mask, extensionp;

  if (strcmp(fullname, DIRSEPSTR) == 0) {
    strcpy(lispname, "<");
    return (1);
  }

#ifdef DOS
  /* Split off the drive, if there is one. */
  if (fullname[1] == DRIVESEP) {
    *lispname++ = *fullname++;
    *lispname++ = *fullname++;
  }
#endif
  
  if (!dirp) {
    /*
     * The characters which are dealt with specially (i.e. are quoted)
     * in the Xerox Lisp file naming convention are all valid in UNIX
     * file name convention.  So the conversion rule is almost
     * straightforward except the "extension" field.  Only glancing
     * the UNIX file name, we cannot determine which period character
     * should be quoted in the result Xerox Lisp file name when more
     * than one period are included in the UNIX file name.  In such
     * case, we have to refer to the Xerox Lisp file name representation
     * which is specified the user.  Thus, at first, extract the
     * name field from the original Lisp file name.
     */
    cp = lispname;
    lnamep = cp - 1;
    while (*cp != '\0') {
      switch (*cp) {
        case '>':
          lnamep = cp + 1;
          cp++;
          break;

        case '\'':
          if (*(cp + 1) != '\0')
            cp += 2;
          else
            cp++;
          break;

        default: cp++; break;
      }
    }
    /* Name field in the UNIX file name representation. */
    cnamep = strrchr(fullname, DIRSEP) + 1;
  } else {
    cnamep = fullname + strlen(fullname);
  }

  /*
   * Conversion rule of file name from UNIX to Xerox Lisp.
   *	UNIX		Lisp
   *	/		<    only if it is used as a root directory
   *			     delimiter.
   *	/		>    if used as a directory delimiter for other
   *			     directories than root directory.
   *	>		'>
   *	;		';
   *	'		''
   *	.		'.   only if it is used as a part of the extension
   *			     field.
   *	others		as if
   */

  cp = fullname + 1;
  dp = namebuf;
  *dp++ = '<';

  if (*cp == '<') {
    /*
     * If the first character of the initial directory is '<',
     * it should be quoted in the result Lisp file name.
     */
    *dp++ = '\'';
    *dp++ = *cp++;
  }

  while (cp < cnamep) {
    switch (*cp) {
      case '>':
      case ';':
#ifndef DOS
      case '\'':
#endif /* DOS */
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

#ifdef DOS
      case '/':
#endif
      case DIRSEP:
        *dp++ = '>';
        cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  if (dirp) {
    if (*(dp - 1) != '>' || *(dp - 2) == '\'') *dp++ = '>';
    *dp = '\0';
    strcpy(lispname, namebuf);
    return (1);
  }

  /*
   * Be careful dealing with the extension field.  If we encounter with the
   * period mark which was quoted in the original Lisp file name, we have
   * to quote it in the result file name.
   * First we count the period mark included in the Lisp file name, and
   * remember the position of the quoted period.  Then when we met the
   * period while we are converting the UNIX file name into Lisp one,
   * examine it if it is a quoted one or not, then if so, we quote it.
   */

  mask = 0;
  i = 1;
  lnamep++;

  while (*lnamep) {
    if (*lnamep == '.') {
      if (lnamep != lispname && *(lnamep - 1) == '\'') mask |= i;
      i <<= 1;
    }
    lnamep++;
  }

  i = 1;
  while (*cp) {
    switch (*cp) {
#ifdef DOS
      case DIRSEP:
        *dp++ = '/';
        cp++;
        break;
#endif
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      case '.':
        if ((i & mask) == i) {
          /* This period should be quoted. */
          *dp++ = '\'';
          *dp++ = *cp++;
        } else {
          *dp++ = *cp++;
        }
        i <<= 1;
        break;

      default: *dp++ = *cp++; break;
    }
  }

  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file name
   * or not.  If extension field is not included, we have to add a period
   * to specify empty extension field.
   */
  strcpy(fbuf, namebuf);
  dp = cp = fbuf;
  while (*cp) {
    switch (*cp) {
      case '>':
        dp = cp;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  cp = dp + 1;
  if (versionp) separate_version(fbuf, ver, 1);
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.': extensionp = 1; break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    *cp++ = '.';
    *cp = '\0';
  }
  if (versionp && *ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }

  /*
   * Now, it's time to convert the version field.
   */
  if (!dirp && versionp) UnixVersionToLispVersion(namebuf, 0);

  strcpy(lispname, namebuf);
  return (1);
}